

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ASTVisitor.h
# Opt level: O0

void __thiscall
slang::ast::ASTVisitor<only_assigned_on_reset::AlwaysFFVisitor,_true,_true,_false,_false>::
visit<slang::ast::InvalidSymbol>
          (ASTVisitor<only_assigned_on_reset::AlwaysFFVisitor,_true,_true,_false,_false> *this,
          InvalidSymbol *t)

{
  InvalidSymbol *in_RDI;
  ASTVisitor<only_assigned_on_reset::AlwaysFFVisitor,_true,_true,_false,_false> *unaff_retaddr;
  
  visitDefault<slang::ast::InvalidSymbol>(unaff_retaddr,in_RDI);
  return;
}

Assistant:

void visit(const T& t) {
        if constexpr (!VisitBad && requires { t.bad(); }) {
            if (t.bad())
                return;
        }

        if constexpr (requires { (DERIVED).handle(t); })
            (DERIVED).handle(t);
        else if constexpr (requires { (DERIVED)(DERIVED, t); })
            (DERIVED)(DERIVED, t);
        else
            visitDefault(t);
    }